

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

int makebkfile(int f,int n)

{
  bool bVar1;
  char *pcVar2;
  
  bVar1 = 0 < n;
  if ((f & 7U) == 0) {
    bVar1 = makebackup == 0;
  }
  makebackup = (int)bVar1;
  pcVar2 = "dis";
  if (bVar1) {
    pcVar2 = "en";
  }
  ewprintf("Backup files %sabled",pcVar2);
  return 1;
}

Assistant:

int
makebkfile(int f, int n)
{
	if (f & FFARG)
		makebackup = n > 0;
	else
		makebackup = !makebackup;
	ewprintf("Backup files %sabled", makebackup ? "en" : "dis");
	return (TRUE);
}